

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(ScriptContext *scriptContext)

{
  anon_class_16_2_197593a1 fn;
  JavascriptFunction *pJVar1;
  ImplicitCallFlags IVar2;
  ThreadContext *this;
  JavascriptLibrary *this_00;
  JavascriptFunction *pJVar3;
  bool local_31;
  JavascriptFunction *pJStack_18;
  ImplicitCallFlags flags;
  Var arrayIteratorPrototypeNext;
  ScriptContext *scriptContext_local;
  
  pJStack_18 = (JavascriptFunction *)0x0;
  arrayIteratorPrototypeNext = scriptContext;
  this = ScriptContext::GetThreadContext(scriptContext);
  fn.scriptContext = (ScriptContext **)&arrayIteratorPrototypeNext;
  fn.arrayIteratorPrototypeNext = &stack0xffffffffffffffe8;
  IVar2 = ThreadContext::
          TryWithDisabledImplicitCall<Js::JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(Js::ScriptContext*)::__0>
                    (this,fn);
  pJVar1 = pJStack_18;
  local_31 = true;
  if (IVar2 == ImplicitCall_None) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)arrayIteratorPrototypeNext);
    pJVar3 = GetArrayIteratorPrototypeBuiltinNextFunction(this_00);
    local_31 = pJVar1 != pJVar3;
  }
  return local_31;
}

Assistant:

bool JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(ScriptContext *scriptContext)
    {
        Var arrayIteratorPrototypeNext = nullptr;
        ImplicitCallFlags flags = scriptContext->GetThreadContext()->TryWithDisabledImplicitCall(
                [&]() { arrayIteratorPrototypeNext = JavascriptOperators::GetPropertyNoCache(scriptContext->GetLibrary()->GetArrayIteratorPrototype(), PropertyIds::next, scriptContext); });

        return (flags != ImplicitCall_None) || arrayIteratorPrototypeNext != scriptContext->GetLibrary()->GetArrayIteratorPrototypeBuiltinNextFunction();
    }